

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O3

stacktrace * cpptrace::stacktrace::current(stacktrace *__return_storage_ptr__,size_t skip)

{
  generate_trace(__return_storage_ptr__,skip + 1);
  return __return_storage_ptr__;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE
    stacktrace stacktrace::current(std::size_t skip) {
        try { // try/catch can never be hit but it's needed to prevent TCO
            return generate_trace(skip + 1);
        } catch(...) {
            if(!detail::should_absorb_trace_exceptions()) {
                throw;
            }
            return stacktrace{};
        }
    }